

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP5Deserializer::GetAbsoluteSteps
          (BP5Deserializer *this,VariableBase *Var,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *keys)

{
  BP5VarRec *VarRec;
  pointer puVar1;
  pointer puVar2;
  iterator __position;
  __node_base_ptr p_Var3;
  size_t *psVar4;
  void *pvVar5;
  __node_base_ptr p_Var6;
  size_t WriterRank;
  ulong WriterRank_00;
  unsigned_long local_38;
  
  p_Var3 = (this->VarByKey)._M_h._M_buckets[(ulong)Var % (this->VarByKey)._M_h._M_bucket_count];
  for (p_Var6 = p_Var3->_M_nxt; (VariableBase *)p_Var6[1]._M_nxt != Var; p_Var6 = p_Var6->_M_nxt) {
    p_Var3 = p_Var6;
  }
  if (this->m_RandomAccessMode == true) {
    VarRec = (BP5VarRec *)p_Var3->_M_nxt[2]._M_nxt;
    local_38 = 0;
    if ((this->m_ControlArray).
        super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_ControlArray).
        super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      WriterRank_00 = 0;
LAB_00621bf0:
      do {
        psVar4 = &this->m_CurrentWriterCohortSize;
        if (this->m_RandomAccessMode == true) {
          puVar1 = (this->m_WriterCohortSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar2 = (this->m_WriterCohortSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (local_38 < (ulong)((long)puVar2 - (long)puVar1 >> 3)) {
            psVar4 = puVar1 + local_38;
          }
          else {
            psVar4 = puVar2 + -1;
          }
        }
        if (WriterRank_00 < *psVar4) {
          pvVar5 = GetMetadataBase(this,VarRec,local_38,WriterRank_00);
          WriterRank_00 = WriterRank_00 + 1;
          if (pvVar5 == (void *)0x0) goto LAB_00621bf0;
          __position._M_current =
               (keys->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (keys->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)keys,__position,
                       &local_38);
          }
          else {
            *__position._M_current = local_38;
            (keys->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        local_38 = local_38 + 1;
        WriterRank_00 = 0;
      } while (local_38 <
               (ulong)(((long)(this->m_ControlArray).
                              super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_ControlArray).
                              super__Vector_base<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
              );
    }
  }
  return;
}

Assistant:

void BP5Deserializer::GetAbsoluteSteps(const VariableBase &Var, std::vector<size_t> &keys) const
{
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);
    if (!m_RandomAccessMode)
        return;

    for (size_t Step = 0; Step < m_ControlArray.size(); Step++)
    {
        for (size_t WriterRank = 0; WriterRank < WriterCohortSize(Step); WriterRank++)
        {
            MetaArrayRec *writer_meta_base =
                (MetaArrayRec *)GetMetadataBase(VarRec, Step, WriterRank);
            if (writer_meta_base)
            {
                keys.push_back(Step);
                break;
            }
        }
    }
}